

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer)

{
  undefined1 uVar1;
  pointer pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  string *psVar7;
  cmState *this;
  ostream *poVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  PolicyStatus status;
  PolicyID PVar12;
  pointer pPVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  allocator<char> local_235;
  uint local_234;
  uint local_230;
  uint local_22c;
  string defaultVar;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream e;
  
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = minorVer + 1;
  uVar10 = patchVer + 1;
  bVar16 = patchVer == 0xffffffff;
  bVar14 = uVar11 < 9;
  bVar17 = minorVer == 8;
  bVar15 = uVar11 < 7;
  bVar18 = minorVer == 6;
  bVar3 = bVar17 && bVar16 || bVar14;
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar12 = CMP0000;
  local_234 = patchVer;
  local_230 = minorVer;
  local_22c = majorVer;
  do {
    if (PVar12 == CMPCOUNT) {
      if (ancientPolicies.
          super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ancientPolicies.
          super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar8 = std::operator<<((ostream *)&e,
                                 "The project requests behavior compatible with CMake version \"");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,".");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,".");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::operator<<(poVar8,"\", which requires the OLD behavior for some policies:\n");
        pPVar2 = ancientPolicies.
                 super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar13 = ancientPolicies.
                       super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar2;
            pPVar13 = pPVar13 + 1) {
          PVar12 = *pPVar13;
          poVar8 = std::operator<<((ostream *)&e,"  ");
          pcVar9 = idToString(PVar12);
          poVar8 = std::operator<<(poVar8,pcVar9);
          poVar8 = std::operator<<(poVar8,": ");
          pcVar9 = idToShortDescription(PVar12);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::operator<<(poVar8,"\n");
        }
        poVar8 = std::operator<<((ostream *)&e,
                                 "However, this version of CMake no longer supports the OLD ");
        poVar8 = std::operator<<(poVar8,"behavior for these policies.  ");
        poVar8 = std::operator<<(poVar8,
                                 "Please either update your CMakeLists.txt files to conform to ");
        poVar8 = std::operator<<(poVar8,
                                 "the new behavior or use an older version of CMake that still ");
        std::operator<<(poVar8,"supports the old behavior.");
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&defaultVar);
        std::__cxx11::string::~string((string *)&defaultVar);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        cmSystemTools::s_FatalErrorOccured = true;
LAB_001f9dd4:
        bVar3 = false;
      }
      std::_Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::~_Vector_base
                (&ancientPolicies.
                  super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>);
      return bVar3;
    }
    switch(PVar12) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      bVar6 = (!bVar18 || !bVar16) && !bVar15;
      goto joined_r0x001f9b1c;
    case CMP0008:
      bVar6 = uVar10 < 2;
      goto joined_r0x001f9bc9;
    case CMP0009:
      bVar6 = uVar10 < 3;
joined_r0x001f9bc9:
      bVar6 = (!bVar6 || !bVar18) && !bVar15;
joined_r0x001f9b1c:
      if ((bVar6 || majorVer != 2) && 1 < majorVer) goto switchD_001f988f_default;
      goto LAB_001f989c;
    case CMP0010:
    case CMP0011:
      bVar6 = uVar10 < 4 && bVar18 || bVar15;
      goto joined_r0x001f9b0f;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      bVar6 = bVar3;
joined_r0x001f9b0f:
      bVar6 = !bVar6;
      goto joined_r0x001f9b1c;
    case CMP0015:
      bVar6 = uVar10 < 2;
      goto joined_r0x001f9ba9;
    case CMP0016:
      bVar6 = uVar10 < 4;
joined_r0x001f9ba9:
      bVar6 = (!bVar17 || !bVar6) && !bVar14;
      goto joined_r0x001f9b1c;
    case CMP0017:
      bVar6 = uVar10 < 5;
      goto joined_r0x001f9c09;
    case CMP0018:
      bVar6 = uVar10 < 10;
joined_r0x001f9c09:
      bVar6 = (!bVar6 || !bVar17) && !bVar14;
      goto joined_r0x001f9b1c;
    case CMP0019:
    case CMP0020:
      bVar6 = uVar10 < 0xc;
      goto joined_r0x001f9b1c;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      bVar6 = uVar10 < 0xd;
joined_r0x001f9b1c:
      bVar6 = (!bVar6 || !bVar17) && !bVar14;
      goto joined_r0x001f9b1c;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      uVar1 = (minorVer != 0 || !bVar16) && minorVer != 0xffffffff;
      goto joined_r0x001f9c29;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      bVar6 = minorVer == 1 && bVar16 || uVar11 < 2;
      goto joined_r0x001f9b89;
    case CMP0055:
    case CMP0056:
      bVar6 = minorVer == 2 && bVar16 || uVar11 < 3;
joined_r0x001f9b89:
      uVar1 = !bVar6;
      goto joined_r0x001f9c29;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      bVar6 = minorVer == 3 && bVar16 || uVar11 < 4;
      goto joined_r0x001f9bb9;
    case CMP0064:
    case CMP0065:
      bVar6 = minorVer == 4 && bVar16 || uVar11 < 5;
      goto joined_r0x001f9bb9;
    case CMP0066:
      bVar6 = minorVer == 7 && bVar16 || uVar11 < 8;
      goto joined_r0x001f9bb9;
    case CMP0067:
      bVar6 = bVar3;
joined_r0x001f9bb9:
      uVar1 = !bVar6;
      goto joined_r0x001f9c29;
    case CMP0068:
    case CMP0069:
      uVar1 = minorVer == 9 && bVar16 || uVar11 < 10;
      break;
    case CMP0070:
    case CMP0071:
      uVar1 = minorVer == 10 && bVar16 || uVar11 < 0xb;
      break;
    case CMP0072:
      uVar1 = minorVer == 0xb && bVar16 || uVar11 < 0xc;
      break;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      uVar1 = minorVer == 0xc && bVar16 || uVar11 < 0xd;
      break;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      uVar1 = minorVer == 0xd && bVar16 || uVar11 < 0xe;
      break;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      uVar1 = minorVer == 0xe && bVar16 || uVar11 < 0xf;
      break;
    case CMP0089:
    case CMP0090:
    case CMP0091:
    case CMP0092:
    case CMP0093:
    case CMP0094:
      uVar1 = minorVer == 0xf && bVar16 || uVar11 < 0x10;
      break;
    case CMP0095:
      uVar1 = minorVer == 0x10 && bVar16 || uVar11 < 0x11;
      break;
    default:
      goto switchD_001f988f_default;
    }
    uVar1 = !(bool)uVar1;
joined_r0x001f9c29:
    if (((bool)uVar1 || majorVer != 3) && 2 < majorVer) {
switchD_001f988f_default:
      bVar6 = cmMakefile::SetPolicy(mf,PVar12,NEW);
      if (!bVar6) goto LAB_001f9dd4;
    }
    else {
LAB_001f989c:
      pcVar9 = idToString(PVar12);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar9,&local_235);
      std::operator+(&defaultVar,"CMAKE_POLICY_DEFAULT_",&local_1e8);
      psVar7 = cmMakefile::GetSafeDefinition(mf,&defaultVar);
      bVar4 = std::operator==(psVar7,"NEW");
      bVar6 = true;
      if (bVar4) {
        status = NEW;
      }
      else {
        bVar5 = std::operator==(psVar7,"OLD");
        status = OLD;
        if ((!bVar5) && (status = WARN, psVar7->_M_string_length != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar8 = std::operator<<((ostream *)&e,(string *)&defaultVar);
          poVar8 = std::operator<<(poVar8," has value \"");
          poVar8 = std::operator<<(poVar8,(string *)psVar7);
          std::operator<<(poVar8,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).");
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar6 = false;
        }
      }
      std::__cxx11::string::~string((string *)&defaultVar);
      if (!bVar6) {
        std::__cxx11::string::~string((string *)&local_1e8);
        goto LAB_001f9dd4;
      }
      bVar6 = cmMakefile::SetPolicy(mf,PVar12,status);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (!bVar6) goto LAB_001f9dd4;
      if (PVar12 == CMP0001 && !bVar4) {
        this = cmMakefile::GetState(mf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&defaultVar);
        psVar7 = cmState::GetInitializedCacheValue(this,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (psVar7 == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&defaultVar);
          cmMakefile::AddCacheDefinition
                    (mf,(string *)&e,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          std::__cxx11::string::~string((string *)&e);
        }
      }
    }
    PVar12 = PVar12 + CMP0001;
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer)
{
  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}